

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

QRectF * __thiscall QGraphicsScene::sceneRect(QGraphicsScene *this)

{
  long lVar1;
  bool bVar2;
  QGraphicsScenePrivate *this_00;
  QRectF *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  QGraphicsScenePrivate *thatd;
  QGraphicsScenePrivate *d;
  QRectF oldGrowingBoundingRect;
  QRectF *r;
  QGraphicsScenePrivate *pQVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  r = in_RDI;
  this_00 = d_func((QGraphicsScene *)0x9c0da3);
  if ((*(uint *)&this_00->field_0xb8 & 1) == 0) {
    pQVar3 = this_00;
    if ((*(uint *)&this_00->field_0xb8 >> 1 & 1) != 0) {
      itemsBoundingRect((QGraphicsScene *)this_00);
      QRectF::operator|=(in_RSI,r);
      *(uint *)&this_00->field_0xb8 = *(uint *)&this_00->field_0xb8 & 0xfffffffd;
      bVar2 = ::operator!=(r,in_RDI);
      if (bVar2) {
        sceneRectChanged((QGraphicsScene *)r,in_RDI);
      }
    }
    in_RDI->xp = (pQVar3->growingItemsBoundingRect).xp;
    in_RDI->yp = (pQVar3->growingItemsBoundingRect).yp;
    in_RDI->w = (pQVar3->growingItemsBoundingRect).w;
    in_RDI->h = (pQVar3->growingItemsBoundingRect).h;
  }
  else {
    in_RDI->xp = (this_00->sceneRect).xp;
    in_RDI->yp = (this_00->sceneRect).yp;
    in_RDI->w = (this_00->sceneRect).w;
    in_RDI->h = (this_00->sceneRect).h;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return r;
}

Assistant:

QRectF QGraphicsScene::sceneRect() const
{
    Q_D(const QGraphicsScene);
    if (d->hasSceneRect)
        return d->sceneRect;

    if (d->dirtyGrowingItemsBoundingRect) {
        // Lazily update the growing items bounding rect
        QGraphicsScenePrivate *thatd = const_cast<QGraphicsScenePrivate *>(d);
        QRectF oldGrowingBoundingRect = thatd->growingItemsBoundingRect;
        thatd->growingItemsBoundingRect |= itemsBoundingRect();
        thatd->dirtyGrowingItemsBoundingRect = false;
        if (oldGrowingBoundingRect != thatd->growingItemsBoundingRect)
            emit const_cast<QGraphicsScene *>(this)->sceneRectChanged(thatd->growingItemsBoundingRect);
    }
    return d->growingItemsBoundingRect;
}